

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void write_file_text(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  bool bVar1;
  FILE *f;
  string *in_RSI;
  undefined8 in_RDI;
  uint *num;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  FILE *fd;
  vector<unsigned_int,_std::allocator<unsigned_int>_> content;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  undefined8 local_68;
  string local_50 [32];
  FILE *local_30;
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x176c96);
  std::__cxx11::string::string(local_50,in_RSI);
  f = (FILE *)fopen_or_fail(in_stack_ffffffffffffff80,(char *)in_RSI);
  std::__cxx11::string::~string(local_50);
  local_68 = local_8;
  local_30 = f;
  local_70._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)f,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         (string *)
         __gnu_cxx::
         __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
         ::operator*(&local_70);
    fprintf(local_30,"%u\n",(ulong)*(uint *)in_stack_ffffffffffffff80);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_70);
  }
  fclose_or_fail((FILE *)f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void write_file_text(std::vector<uint32_t>& nums, std::string file_name)
{
    std::vector<uint32_t> content;
    auto fd = fopen_or_fail(file_name, "w");
    for (auto& num : nums) {
        fprintf(fd, "%u\n", num);
    }
    fclose_or_fail(fd);
}